

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O3

Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
rc::gen::container<std::__cxx11::string,char>
          (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,gen *this,Gen<char> *gens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IGenImpl *pIVar2;
  undefined1 local_40;
  Gen<char> local_38;
  
  Gen<char>::Gen(&local_38,(Gen<char> *)this);
  pIVar2 = (IGenImpl *)operator_new(0x40);
  pIVar2->_vptr_IGenImpl = (_func_int **)&PTR_generate_001b2368;
  paVar1 = &local_38.m_name.field_2;
  *(undefined1 *)&pIVar2[1]._vptr_IGenImpl = local_40;
  pIVar2[2]._vptr_IGenImpl = (_func_int **)local_38.m_impl;
  pIVar2[3]._vptr_IGenImpl = (_func_int **)(pIVar2 + 5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_name._M_dataplus._M_p == paVar1) {
    pIVar2[5]._vptr_IGenImpl =
         (_func_int **)
         CONCAT71(local_38.m_name.field_2._M_allocated_capacity._1_7_,
                  local_38.m_name.field_2._M_local_buf[0]);
    pIVar2[6]._vptr_IGenImpl = (_func_int **)local_38.m_name.field_2._8_8_;
  }
  else {
    pIVar2[3]._vptr_IGenImpl = (_func_int **)local_38.m_name._M_dataplus._M_p;
    pIVar2[5]._vptr_IGenImpl =
         (_func_int **)
         CONCAT71(local_38.m_name.field_2._M_allocated_capacity._1_7_,
                  local_38.m_name.field_2._M_local_buf[0]);
  }
  pIVar2[4]._vptr_IGenImpl = (_func_int **)local_38.m_name._M_string_length;
  local_38.m_name._M_string_length = 0;
  local_38.m_name.field_2._M_local_buf[0] = '\0';
  local_38.m_impl = (IGenImpl *)0x0;
  pIVar2[7]._vptr_IGenImpl = (_func_int **)0x1;
  __return_storage_ptr__->m_impl = pIVar2;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  local_38.m_name._M_dataplus._M_p = (pointer)paVar1;
  Gen<char>::~Gen(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Gen<Container> container(Gen<Ts>... gens) {
  using Strategy = detail::GenericContainerStrategy<Container>;
  detail::ContainerHelper<Container, Strategy> helper{Strategy()};

  return [=](const Random &random, int size) {
    return helper.generate(random, size, gens...);
  };
}